

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall Board::set_position(Board *this,Ship *ship)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  if ((ship->length == 1) && (ship->ID == 'S')) {
    std::__cxx11::string::assign
              ((char *)((long)ship->sCol * 0x20 +
                       *(long *)&(this->matrix).
                                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data));
  }
  if (ship->orientation == 'V') {
    if (ship->direction == -2) {
      iVar2 = ship->sRow;
      lVar4 = (long)iVar2;
      lVar5 = lVar4 * 0x18;
      while (iVar2 - ship->length < lVar4) {
        if ((int)lVar4 == iVar2) {
          pcVar3 = (char *)((long)ship->sCol * 0x20 +
                           *(long *)((long)&(((this->matrix).
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar5));
        }
        else {
          pcVar3 = (char *)((long)ship->sCol * 0x20 +
                           *(long *)((long)&(((this->matrix).
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar5));
        }
        std::__cxx11::string::assign(pcVar3);
        lVar4 = lVar4 + -1;
        lVar5 = lVar5 + -0x18;
        iVar2 = ship->sRow;
      }
    }
    else if (ship->direction == 2) {
      iVar2 = ship->sRow;
      lVar4 = (long)iVar2;
      lVar5 = lVar4 * 0x18;
      for (; lVar4 < (long)iVar2 + (long)ship->length; lVar4 = lVar4 + 1) {
        if ((int)lVar4 == iVar2) {
          pcVar3 = (char *)((long)ship->sCol * 0x20 +
                           *(long *)((long)&(((this->matrix).
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar5));
        }
        else {
          pcVar3 = (char *)((long)ship->sCol * 0x20 +
                           *(long *)((long)&(((this->matrix).
                                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar5));
        }
        std::__cxx11::string::assign(pcVar3);
        iVar2 = ship->sRow;
        lVar5 = lVar5 + 0x18;
      }
    }
  }
  else if (ship->orientation == 'H') {
    if (ship->direction == -1) {
      iVar2 = ship->sCol;
      lVar4 = (long)iVar2;
      lVar5 = lVar4 << 5;
      while (iVar2 - ship->length < lVar4) {
        if ((int)lVar4 == iVar2) {
          lVar1 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        else {
          lVar1 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        std::__cxx11::string::assign((char *)(lVar1 + lVar5));
        lVar4 = lVar4 + -1;
        lVar5 = lVar5 + -0x20;
        iVar2 = ship->sCol;
      }
    }
    else if (ship->direction == 1) {
      iVar2 = ship->sCol;
      lVar4 = (long)iVar2;
      lVar5 = lVar4 << 5;
      for (; lVar4 < (long)iVar2 + (long)ship->length; lVar4 = lVar4 + 1) {
        if ((int)lVar4 == iVar2) {
          lVar1 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        else {
          lVar1 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[ship->sRow].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        std::__cxx11::string::assign((char *)(lVar1 + lVar5));
        iVar2 = ship->sCol;
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void set_position( Ship *ship )
        {
            if( ship->length == 1 and ship->ID == 'S')
            {
                matrix[ship->sRow][ship->sCol] = "⬤";
            }

            if( ship->orientation == 'H' )
            {
                if( ship->direction == 1 )
                {
                    for( int j = ship->sCol; j < ship->sCol + ship->length; j++ )
                    {
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else if( j == ship->sCol + ship->length - 1 )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
                else if( ship->direction == -1 )
                { 
                    for( int j = ship->sCol; j > ship->sCol - ship->length; j-- )
                    { 
                        if( j == ship->sCol )
                        {
                            matrix[ship->sRow][j] = "▶";
                        }
                        else if( j == ship->sCol - ( ship->length - 1 ) )
                        {
                            matrix[ship->sRow][j] = "◀";
                        }
                        else
                        {
                            matrix[ship->sRow][j] = "■";
                        }
                    }
                }
            }
            else if( ship->orientation == 'V' )
            {
                if( ship->direction == 2 )
                {
                    for( int i = ship->sRow; i < ship->sRow + ship->length; i++ )
                    {
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else if( i == ship->sRow + ship->length - 1 )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
                else if( ship->direction == -2 )
                {
                    for( int i = ship->sRow; i > ship->sRow - ship->length; i-- )
                    { 
                        if( i == ship->sRow )
                        {
                            matrix[i][ship->sCol] = "▼";
                        }
                        else if( i == ship->sRow - ( ship->length - 1 ) )
                        {
                            matrix[i][ship->sCol] = "▲";
                        }
                        else
                        {
                            matrix[i][ship->sCol] = "■";
                        }
                    }
                }
             }
        }